

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_compress_usingDict
                 (ZSTD_CCtx *cctx,void *dst,size_t dstCapacity,void *src,size_t srcSize,void *dict,
                 size_t dictSize,int compressionLevel)

{
  size_t sVar1;
  size_t local_108;
  undefined1 local_f0 [8];
  ZSTD_CCtx_params cctxParams;
  ZSTD_parameters params;
  void *dict_local;
  size_t srcSize_local;
  void *src_local;
  size_t dstCapacity_local;
  void *dst_local;
  ZSTD_CCtx *cctx_local;
  
  if (dict == (void *)0x0) {
    local_108 = 0;
  }
  else {
    local_108 = dictSize;
  }
  ZSTD_getParams_internal
            ((ZSTD_parameters *)&cctxParams.customMem.opaque,compressionLevel,srcSize,local_108);
  ZSTD_assignParamsToCCtxParams
            ((ZSTD_CCtx_params *)local_f0,&cctx->requestedParams,
             (ZSTD_parameters *)&cctxParams.customMem.opaque);
  if (params.cParams.targetLength == 1) {
    sVar1 = ZSTD_compress_advanced_internal
                      (cctx,dst,dstCapacity,src,srcSize,dict,dictSize,(ZSTD_CCtx_params *)local_f0);
    return sVar1;
  }
  __assert_fail("params.fParams.contentSizeFlag == 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                ,0x3700,
                "size_t ZSTD_compress_usingDict(ZSTD_CCtx *, void *, size_t, const void *, size_t, const void *, size_t, int)"
               );
}

Assistant:

size_t ZSTD_compress_usingDict(ZSTD_CCtx* cctx,
                               void* dst, size_t dstCapacity,
                         const void* src, size_t srcSize,
                         const void* dict, size_t dictSize,
                               int compressionLevel)
{
    ZSTD_parameters const params = ZSTD_getParams_internal(compressionLevel, srcSize, dict ? dictSize : 0);
    ZSTD_CCtx_params cctxParams = ZSTD_assignParamsToCCtxParams(&cctx->requestedParams, &params);
    assert(params.fParams.contentSizeFlag == 1);
    return ZSTD_compress_advanced_internal(cctx, dst, dstCapacity, src, srcSize, dict, dictSize, &cctxParams);
}